

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndChild(void)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ImVec2 sz;
  ImRect bb;
  ImVec2 local_40;
  ImRect local_38;
  ImRect local_28;
  
  pIVar3 = GImGui;
  if (GImGui->WithinEndChild != false) {
    __assert_fail("g.WithinEndChild == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1368,"void ImGui::EndChild()");
  }
  pIVar2 = GImGui->CurrentWindow;
  if ((pIVar2->Flags & 0x1000000) != 0) {
    GImGui->WithinEndChild = true;
    if (pIVar2->BeginCount < 2) {
      local_40 = pIVar2->Size;
      if ((pIVar2->AutoFitChildAxises & 1U) != 0) {
        auVar4 = vmaxss_avx(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)local_40.x));
        local_40.x = auVar4._0_4_;
      }
      if ((pIVar2->AutoFitChildAxises & 2U) != 0) {
        auVar4 = vmaxss_avx(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)local_40.y));
        local_40.y = auVar4._0_4_;
      }
      End();
      IVar1 = (pIVar3->CurrentWindow->DC).CursorPos;
      auVar4._8_8_ = 0;
      auVar4._0_4_ = IVar1.x;
      auVar4._4_4_ = IVar1.y;
      auVar6._0_4_ = IVar1.x + local_40.x;
      auVar6._4_4_ = IVar1.y + local_40.y;
      auVar6._8_8_ = 0;
      local_38 = (ImRect)vmovlhps_avx(auVar4,auVar6);
      ItemSize(&local_40,-1.0);
      if ((((pIVar2->DC).NavLayerActiveMask == 0) && ((pIVar2->DC).NavHasScroll != true)) ||
         ((pIVar2->Flags & 0x800000) != 0)) {
        ItemAdd(&local_38,0,(ImRect *)0x0);
      }
      else {
        ItemAdd(&local_38,pIVar2->ChildId,(ImRect *)0x0);
        RenderNavHighlight(&local_38,pIVar2->ChildId,1);
        if (((pIVar2->DC).NavLayerActiveMask == 0) && (pIVar2 == pIVar3->NavWindow)) {
          auVar5._8_4_ = 0xc0000000;
          auVar5._0_8_ = 0xc0000000c0000000;
          auVar5._12_4_ = 0xc0000000;
          auVar7._8_4_ = 0x40000000;
          auVar7._0_8_ = 0x4000000040000000;
          auVar7._12_4_ = 0x40000000;
          auVar4 = vmovlhps_avx(auVar5,auVar7);
          local_28.Min.x = auVar4._0_4_ + local_38.Min.x;
          local_28.Min.y = auVar4._4_4_ + local_38.Min.y;
          local_28.Max.x = auVar4._8_4_ + local_38.Max.x;
          local_28.Max.y = auVar4._12_4_ + local_38.Max.y;
          RenderNavHighlight(&local_28,pIVar3->NavId,2);
        }
      }
    }
    else {
      End();
    }
    pIVar3->WithinEndChild = false;
    pIVar3->LogLinePosY = -3.4028235e+38;
    return;
  }
  __assert_fail("window->Flags & ImGuiWindowFlags_ChildWindow",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x1369,"void ImGui::EndChild()");
}

Assistant:

void ImGui::EndChild()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    IM_ASSERT(g.WithinEndChild == false);
    IM_ASSERT(window->Flags & ImGuiWindowFlags_ChildWindow);   // Mismatched BeginChild()/EndChild() calls

    g.WithinEndChild = true;
    if (window->BeginCount > 1)
    {
        End();
    }
    else
    {
        ImVec2 sz = window->Size;
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_X)) // Arbitrary minimum zero-ish child size of 4.0f causes less trouble than a 0.0f
            sz.x = ImMax(4.0f, sz.x);
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_Y))
            sz.y = ImMax(4.0f, sz.y);
        End();

        ImGuiWindow* parent_window = g.CurrentWindow;
        ImRect bb(parent_window->DC.CursorPos, parent_window->DC.CursorPos + sz);
        ItemSize(sz);
        if ((window->DC.NavLayerActiveMask != 0 || window->DC.NavHasScroll) && !(window->Flags & ImGuiWindowFlags_NavFlattened))
        {
            ItemAdd(bb, window->ChildId);
            RenderNavHighlight(bb, window->ChildId);

            // When browsing a window that has no activable items (scroll only) we keep a highlight on the child
            if (window->DC.NavLayerActiveMask == 0 && window == g.NavWindow)
                RenderNavHighlight(ImRect(bb.Min - ImVec2(2, 2), bb.Max + ImVec2(2, 2)), g.NavId, ImGuiNavHighlightFlags_TypeThin);
        }
        else
        {
            // Not navigable into
            ItemAdd(bb, 0);
        }
    }
    g.WithinEndChild = false;
    g.LogLinePosY = -FLT_MAX; // To enforce a carriage return
}